

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall
cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl
          (cmELFInternalImpl<cmELFTypes32> *this,cmELF *external,
          unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  bool bVar1;
  uint uVar2;
  ostream *this_00;
  char *msg;
  uint local_23c;
  uint local_1dc;
  string local_1d8 [4];
  uint i;
  ostringstream local_1b8 [8];
  ostringstream e;
  uint eti;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_30;
  ByteOrderType local_24;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *puStack_20;
  ByteOrderType order_local;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  *fin_local;
  cmELF *external_local;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  local_24 = order;
  puStack_20 = fin;
  fin_local = (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               *)external;
  external_local = (cmELF *)this;
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::unique_ptr(&local_30,fin);
  cmELFInternal::cmELFInternal(&this->super_cmELFInternal,external,&local_30,local_24);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&local_30);
  (this->super_cmELFInternal)._vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternalImpl_00517208;
  std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::vector(&this->SectionHeaders);
  std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::vector(&this->DynamicSectionEntries);
  bVar1 = Read(this,&this->ELFHeader);
  if (bVar1) {
    switch((this->ELFHeader).e_type) {
    case 0:
      cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"ELF file type is NONE.");
      return;
    case 1:
      (this->super_cmELFInternal).ELFType = FileTypeRelocatableObject;
      break;
    case 2:
      (this->super_cmELFInternal).ELFType = FileTypeExecutable;
      break;
    case 3:
      (this->super_cmELFInternal).ELFType = FileTypeSharedLibrary;
      break;
    case 4:
      (this->super_cmELFInternal).ELFType = FileTypeCore;
      break;
    default:
      uVar2 = (uint)(this->ELFHeader).e_type;
      if ((uVar2 < 0xfe00) || (0xfeff < uVar2)) {
        if ((uVar2 < 0xff00) || (0xffff < uVar2)) {
          std::__cxx11::ostringstream::ostringstream(local_1b8);
          this_00 = std::operator<<((ostream *)local_1b8,"Unknown ELF file type ");
          std::ostream::operator<<(this_00,uVar2);
          std::__cxx11::ostringstream::str();
          msg = (char *)std::__cxx11::string::c_str();
          cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
          std::__cxx11::string::~string(local_1d8);
          std::__cxx11::ostringstream::~ostringstream(local_1b8);
          return;
        }
        (this->super_cmELFInternal).ELFType = FileTypeSpecificProc;
      }
      else {
        (this->super_cmELFInternal).ELFType = FileTypeSpecificOS;
      }
    }
    (this->super_cmELFInternal).Machine = (this->ELFHeader).e_machine;
    if ((this->ELFHeader).e_shnum == 0) {
      local_23c = 1;
    }
    else {
      local_23c = (uint)(this->ELFHeader).e_shnum;
    }
    std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::resize
              (&this->SectionHeaders,(long)(int)local_23c);
    LoadSectionHeader(this,0);
    uVar2 = (*(this->super_cmELFInternal)._vptr_cmELFInternal[2])();
    std::vector<Elf32_Shdr,_std::allocator<Elf32_Shdr>_>::resize(&this->SectionHeaders,(ulong)uVar2)
    ;
    for (local_1dc = 1; uVar2 = (*(this->super_cmELFInternal)._vptr_cmELFInternal[2])(),
        local_1dc < uVar2; local_1dc = local_1dc + 1) {
      bVar1 = LoadSectionHeader(this,local_1dc);
      if (!bVar1) {
        cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to load section headers.")
        ;
        return;
      }
    }
  }
  else {
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,"Failed to read main ELF header.");
  }
  return;
}

Assistant:

cmELFInternalImpl<Types>::cmELFInternalImpl(cmELF* external,
                                            std::unique_ptr<std::istream> fin,
                                            ByteOrderType order)
  : cmELFInternal(external, std::move(fin), order)
{
  // Read the main header.
  if (!this->Read(this->ELFHeader)) {
    this->SetErrorMessage("Failed to read main ELF header.");
    return;
  }

  // Determine the ELF file type.
  switch (this->ELFHeader.e_type) {
    case ET_NONE:
      this->SetErrorMessage("ELF file type is NONE.");
      return;
    case ET_REL:
      this->ELFType = cmELF::FileTypeRelocatableObject;
      break;
    case ET_EXEC:
      this->ELFType = cmELF::FileTypeExecutable;
      break;
    case ET_DYN:
      this->ELFType = cmELF::FileTypeSharedLibrary;
      break;
    case ET_CORE:
      this->ELFType = cmELF::FileTypeCore;
      break;
    default: {
      unsigned int eti = static_cast<unsigned int>(this->ELFHeader.e_type);
      if (eti >= ET_LOOS && eti <= ET_HIOS) {
        this->ELFType = cmELF::FileTypeSpecificOS;
        break;
      }
      if (eti >= ET_LOPROC && eti <= ET_HIPROC) {
        this->ELFType = cmELF::FileTypeSpecificProc;
        break;
      }
      std::ostringstream e;
      e << "Unknown ELF file type " << eti;
      this->SetErrorMessage(e.str().c_str());
      return;
    }
  }

  this->Machine = this->ELFHeader.e_machine;

  // Load the section headers.
  this->SectionHeaders.resize(
    this->ELFHeader.e_shnum == 0 ? 1 : this->ELFHeader.e_shnum);
  this->LoadSectionHeader(0);
  this->SectionHeaders.resize(this->GetNumberOfSections());
  for (unsigned int i = 1; i < this->GetNumberOfSections(); ++i) {
    if (!this->LoadSectionHeader(i)) {
      this->SetErrorMessage("Failed to load section headers.");
      return;
    }
  }
}